

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall tetgenmesh::checkconforming(tetgenmesh *this,int flag)

{
  double dVar1;
  double dVar2;
  double dVar3;
  memorypool *pmVar4;
  void **ppvVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  ulong uVar9;
  tetgenmesh *ptVar10;
  tetgenio *ptVar11;
  double *pdVar12;
  bool bVar13;
  void *pvVar14;
  ulong uVar15;
  bool bVar16;
  long lVar17;
  uint uVar18;
  tetgenmesh *this_00;
  ulong uVar19;
  uint uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double D;
  int indx [4];
  uint local_148;
  uint local_144;
  double local_130;
  undefined1 local_128 [16];
  double local_118;
  double local_108 [4];
  double local_e8;
  undefined8 uStack_e0;
  double local_d8;
  double dStack_d0;
  int local_c8 [4];
  undefined1 local_b8 [16];
  double local_a8;
  double local_98;
  double dStack_90;
  double local_88;
  double local_78;
  double local_70;
  double local_68;
  
  local_148 = 0;
  if ((flag & 1U) != 0) {
    if (this->b->quiet == 0) {
      puts("  Checking conforming property of segments...");
    }
    pmVar4 = this->subsegs;
    ppvVar5 = pmVar4->firstblock;
    pmVar4->pathblock = ppvVar5;
    pmVar4->pathitem =
         (void *)((long)ppvVar5 +
                 (((long)pmVar4->alignbytes + 8U) -
                 (ulong)(ppvVar5 + 1) % (ulong)(long)pmVar4->alignbytes));
    pmVar4->pathitemsleft = pmVar4->itemsperblock;
    while (pvVar14 = memorypool::traverse(pmVar4), pvVar14 != (void *)0x0) {
      if (*(long *)((long)pvVar14 + 0x18) != 0) {
        local_148 = 0;
        do {
          pdVar6 = *(double **)((long)pvVar14 + 0x18);
          pdVar7 = *(double **)((long)pvVar14 + 0x20);
          dVar1 = *pdVar7;
          dVar22 = pdVar7[1];
          dVar21 = *pdVar6;
          dVar23 = pdVar6[1];
          dVar2 = pdVar7[2];
          dVar3 = pdVar6[2];
          lVar17 = 0;
          do {
            local_108[lVar17] = (pdVar6[lVar17] + pdVar7[lVar17]) * 0.5;
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
          dVar1 = SQRT((dVar2 - dVar3) * (dVar2 - dVar3) +
                       (dVar1 - dVar21) * (dVar1 - dVar21) + (dVar22 - dVar23) * (dVar22 - dVar23))
                  * 0.5;
          uVar15 = *(ulong *)((long)pvVar14 + 0x48) & 0xfffffffffffffff0;
          if (uVar15 != 0) {
            uVar20 = (uint)*(ulong *)((long)pvVar14 + 0x48) & 0xf;
            uVar19 = uVar15;
            do {
              pdVar8 = *(double **)(uVar19 + (long)apexpivot[(int)uVar20] * 8);
              if (((pdVar8 != this->dummypoint) &&
                  (dVar22 = SQRT((local_108[2] - pdVar8[2]) * (local_108[2] - pdVar8[2]) +
                                 (local_108[0] - *pdVar8) * (local_108[0] - *pdVar8) +
                                 (local_108[1] - pdVar8[1]) * (local_108[1] - pdVar8[1])) - dVar1,
                  dVar22 < 0.0)) && (this->b->epsilon < ABS(dVar22) / dVar1)) {
                printf("  !! !! Non-conforming segment: (%d, %d)\n",
                       (ulong)*(uint *)((long)pdVar6 + (long)this->pointmarkindex * 4),
                       (ulong)*(uint *)((long)pdVar7 + (long)this->pointmarkindex * 4));
                local_148 = local_148 + 1;
                break;
              }
              uVar9 = *(ulong *)(uVar19 + (long)facepivot1[(int)uVar20] * 8);
              uVar19 = uVar9 & 0xfffffffffffffff0;
              uVar20 = facepivot2[(int)uVar20][(uint)uVar9 & 0xf];
            } while (uVar19 != uVar15);
          }
          pmVar4 = this->subsegs;
          do {
            pvVar14 = memorypool::traverse(pmVar4);
            if (pvVar14 == (void *)0x0) {
              if (local_148 == 0) goto LAB_0015061c;
              printf("  !! !! %d subsegments are non-conforming.\n",(ulong)local_148);
              goto LAB_00150637;
            }
          } while (*(long *)((long)pvVar14 + 0x18) == 0);
        } while( true );
      }
    }
LAB_0015061c:
    local_148 = 0;
    if (this->b->quiet == 0) {
      puts("  The segments are conforming Delaunay.");
      local_148 = 0;
    }
  }
LAB_00150637:
  local_144 = 0;
  if ((flag & 2U) != 0) {
    if (this->b->quiet == 0) {
      puts("  Checking conforming property of subfaces...");
    }
    ptVar10 = (tetgenmesh *)this->subfaces;
    ptVar11 = ptVar10->in;
    ptVar10->tetrahedrons = (memorypool *)ptVar11;
    ptVar10->subfaces =
         (memorypool *)
         ((long)ptVar11 +
         (((long)*(int *)&ptVar10->subsegs + 8U) -
         (ulong)&ptVar11->useindex % (ulong)(long)*(int *)&ptVar10->subsegs));
    *(int *)((long)&ptVar10->badtetrahedrons + 4) = *(int *)((long)&ptVar10->points + 4);
    while (this_00 = ptVar10, pvVar14 = memorypool::traverse((memorypool *)ptVar10),
          pvVar14 != (void *)0x0) {
      if (*(long *)((long)pvVar14 + 0x18) != 0) {
        local_144 = 0;
        uVar20 = 0;
        do {
          pdVar6 = *(double **)((long)pvVar14 + 0x18);
          pdVar7 = *(double **)((long)pvVar14 + 0x20);
          pdVar8 = *(double **)((long)pvVar14 + 0x28);
          local_d8 = *pdVar6;
          dStack_d0 = pdVar6[1];
          dVar1 = *pdVar7 - local_d8;
          dVar22 = pdVar7[1] - dStack_d0;
          local_b8._8_4_ = SUB84(dVar22,0);
          local_b8._0_8_ = dVar1;
          local_b8._12_4_ = (int)((ulong)dVar22 >> 0x20);
          local_e8 = pdVar6[2];
          local_98 = *pdVar8 - local_d8;
          dStack_90 = pdVar8[1] - dStack_d0;
          uStack_e0 = 0;
          local_a8 = pdVar7[2] - local_e8;
          local_88 = pdVar8[2] - local_e8;
          local_68 = dVar1 * dStack_90 - dVar22 * local_98;
          local_78 = dVar22 * local_88 - dStack_90 * local_a8;
          local_70 = -(local_88 * dVar1 - local_a8 * local_98);
          dVar21 = (local_88 * local_88 + local_98 * local_98 + dStack_90 * dStack_90) * 0.5;
          local_128._8_4_ = SUB84(dVar21,0);
          local_128._0_8_ = (local_a8 * local_a8 + dVar1 * dVar1 + dVar22 * dVar22) * 0.5;
          local_128._12_4_ = (int)((ulong)dVar21 >> 0x20);
          local_118 = 0.0;
          bVar13 = lu_decmp(this_00,(double (*) [4])local_b8,3,local_c8,&local_130,0);
          if (bVar13) {
            lu_solve(this_00,(double (*) [4])local_b8,3,local_c8,(double *)local_128,0);
            dVar1 = SQRT(local_118 * local_118 +
                         (double)local_128._0_8_ * (double)local_128._0_8_ +
                         (double)local_128._8_8_ * (double)local_128._8_8_);
            bVar13 = true;
            do {
              bVar16 = bVar13;
              uVar15 = *(ulong *)((long)pvVar14 + (ulong)uVar20 * 8 + 0x48);
              uVar18 = (uint)uVar15 & 0xf;
              uVar15 = uVar15 & 0xfffffffffffffff0;
              if (uVar15 != 0) {
                uVar18 = stpivottbl[uVar18][uVar20];
              }
              if ((*(point *)(uVar15 + 0x38) != this->dummypoint) &&
                 (pdVar12 = *(double **)(uVar15 + (long)oppopivot[(int)uVar18] * 8),
                 dVar21 = (local_d8 + (double)local_128._0_8_) - *pdVar12,
                 dVar23 = (dStack_d0 + (double)local_128._8_8_) - pdVar12[1],
                 dVar22 = (local_e8 + local_118) - pdVar12[2],
                 dVar22 = SQRT(dVar22 * dVar22 + dVar21 * dVar21 + dVar23 * dVar23),
                 uVar15 = -(ulong)(ABS(dVar22 - dVar1) / dVar1 < this->b->epsilon),
                 (double)(uVar15 & (ulong)dVar1 | ~uVar15 & (ulong)dVar22) < dVar1)) {
                lVar17 = (long)this->pointmarkindex;
                printf("  !! !! Non-conforming subface: (%d, %d, %d)\n",
                       (ulong)*(uint *)((long)pdVar6 + lVar17 * 4),
                       (ulong)*(uint *)((long)pdVar7 + lVar17 * 4),
                       (ulong)*(uint *)((long)pdVar8 + lVar17 * 4));
                local_144 = local_144 + 1;
                break;
              }
              uVar20 = uVar20 ^ 1;
              bVar13 = false;
            } while (bVar16);
          }
          ptVar10 = (tetgenmesh *)this->subfaces;
          do {
            this_00 = ptVar10;
            pvVar14 = memorypool::traverse((memorypool *)ptVar10);
            if (pvVar14 == (void *)0x0) {
              if (local_144 == 0) goto LAB_001509cd;
              printf("  !! !! %d subfaces are non-conforming.\n",(ulong)local_144);
              goto LAB_001509e9;
            }
          } while (*(long *)((long)pvVar14 + 0x18) == 0);
        } while( true );
      }
    }
LAB_001509cd:
    local_144 = 0;
    if (this->b->quiet == 0) {
      puts("  The subfaces are conforming Delaunay.");
    }
  }
LAB_001509e9:
  return local_144 + local_148;
}

Assistant:

int tetgenmesh::checkconforming(int flag)
{
  triface searchtet, neightet, spintet;
  face shloop;
  face segloop;
  point eorg, edest, eapex, pa, pb, pc;
  REAL cent[3], radius, dist, diff, rd, len;
  bool enq;
  int encsubsegs, encsubfaces;
  int t1ver; 
  int i;

  REAL A[4][4], rhs[4], D;
  int indx[4];
  REAL elen[3];

  encsubsegs = 0;

  if (flag & 1) {
    if (!b->quiet) {
      printf("  Checking conforming property of segments...\n");
    }
    encsubsegs = 0;

    // Run through the list of subsegments, check each one.
    subsegs->traversalinit();
    segloop.sh = shellfacetraverse(subsegs);
    while (segloop.sh != (shellface *) NULL) {
      eorg = (point) segloop.sh[3];
      edest = (point) segloop.sh[4];
      radius = 0.5 * distance(eorg, edest);
      for (i = 0; i < 3; i++) cent[i] = 0.5 * (eorg[i] + edest[i]);

      enq = false;
      sstpivot1(segloop, neightet);
      if (neightet.tet != NULL) {
        spintet = neightet;
        while (1) {
          eapex= apex(spintet);
          if (eapex != dummypoint) {
            dist = distance(eapex, cent);
            diff = dist - radius;
            if (fabs(diff) / radius <= b->epsilon) diff = 0.0; // Rounding.
            if (diff < 0) {
              enq = true; break;
            }
          }
          fnextself(spintet);
          if (spintet.tet == neightet.tet) break;
        }
      }
      if (enq) {
        printf("  !! !! Non-conforming segment: (%d, %d)\n",
               pointmark(eorg), pointmark(edest));
        encsubsegs++;
      }
      segloop.sh = shellfacetraverse(subsegs);
    }

    if (encsubsegs == 0) {
      if (!b->quiet) {
        printf("  The segments are conforming Delaunay.\n");
      }
    } else {
      printf("  !! !! %d subsegments are non-conforming.\n", encsubsegs);
    }
  } // if (flag & 1)

  encsubfaces = 0;

  if (flag & 2) {
    if (!b->quiet) {
      printf("  Checking conforming property of subfaces...\n");
    }

    // Run through the list of subfaces, check each one.
    subfaces->traversalinit();
    shloop.sh = shellfacetraverse(subfaces);
    while (shloop.sh != (shellface *) NULL) {
      pa = (point) shloop.sh[3];
      pb = (point) shloop.sh[4];
      pc = (point) shloop.sh[5];

      // Compute the coefficient matrix A (3x3).
      A[0][0] = pb[0] - pa[0];
      A[0][1] = pb[1] - pa[1];
      A[0][2] = pb[2] - pa[2]; // vector V1 (pa->pb)
      A[1][0] = pc[0] - pa[0];
      A[1][1] = pc[1] - pa[1];
      A[1][2] = pc[2] - pa[2]; // vector V2 (pa->pc)
      cross(A[0], A[1], A[2]); // vector V3 (V1 X V2)

      // Compute the right hand side vector b (3x1).
      elen[0] = dot(A[0], A[0]);
      elen[1] = dot(A[1], A[1]);
      rhs[0] = 0.5 * elen[0];
      rhs[1] = 0.5 * elen[1];
      rhs[2] = 0.0;

      if (lu_decmp(A, 3, indx, &D, 0)) {
        lu_solve(A, 3, indx, rhs, 0);
        cent[0] = pa[0] + rhs[0];
        cent[1] = pa[1] + rhs[1];
        cent[2] = pa[2] + rhs[2];
        rd = sqrt(rhs[0] * rhs[0] + rhs[1] * rhs[1] + rhs[2] * rhs[2]);

        // Check if this subface is encroached.
        for (i = 0; i < 2; i++) {
          stpivot(shloop, searchtet);
          if (!ishulltet(searchtet)) {
            len = distance(oppo(searchtet), cent);
            if ((fabs(len - rd) / rd) < b->epsilon) len = rd; // Rounding.
            if (len < rd) {
              printf("  !! !! Non-conforming subface: (%d, %d, %d)\n",
                     pointmark(pa), pointmark(pb), pointmark(pc));
              encsubfaces++;
              enq = true; break;
            }
          }
          sesymself(shloop);
        }
      }
      shloop.sh = shellfacetraverse(subfaces);
    }

    if (encsubfaces == 0) {
      if (!b->quiet) {
        printf("  The subfaces are conforming Delaunay.\n");
      }
    } else {
      printf("  !! !! %d subfaces are non-conforming.\n", encsubfaces);
    }
  } // if (flag & 2)

  return encsubsegs + encsubfaces;
}